

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O3

void __thiscall serial::SerialException::~SerialException(SerialException *this)

{
  ~SerialException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~SerialException() throw() {}